

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCore.c
# Opt level: O1

Cnf_Dat_t * Cnf_DeriveOtherWithMan(Cnf_Man_t *p,Aig_Man_t *pAig,int fSkipTtMin)

{
  int iVar1;
  Aig_MmFixed_t *p_00;
  Vec_Ptr_t *vMapped;
  Cnf_Dat_t *pCVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_40;
  
  p->pManAig = pAig;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p_00 = Dar_ManComputeCuts(pAig,10,fSkipTtMin,0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeCuts = lVar5 + lVar4;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Cnf_DeriveMapping(p);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeMap = lVar5 + lVar4;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Cnf_ManTransferCuts(p);
  vMapped = Cnf_ManScanMapping(p,1,1);
  pCVar2 = Cnf_ManWriteCnfOther(p,vMapped);
  pVVar3 = Cnf_ManWriteCnfMapping(p,vMapped);
  pCVar2->vMapping = pVVar3;
  if (vMapped->pArray != (void **)0x0) {
    free(vMapped->pArray);
    vMapped->pArray = (void **)0x0;
  }
  if (vMapped != (Vec_Ptr_t *)0x0) {
    free(vMapped);
  }
  Aig_MmFixedStop(p_00,0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeSave = lVar5 + lVar4;
  Aig_ManResetRefs(pAig);
  return pCVar2;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveOtherWithMan( Cnf_Man_t * p, Aig_Man_t * pAig, int fSkipTtMin )
{
    Cnf_Dat_t * pCnf;
    Vec_Ptr_t * vMapped;
    Aig_MmFixed_t * pMemCuts;
    abctime clk;
    // connect the managers
    p->pManAig = pAig;

    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( pAig, 10, fSkipTtMin, 0 );
p->timeCuts = Abc_Clock() - clk;

    // find the mapping
clk = Abc_Clock();
    Cnf_DeriveMapping( p );
p->timeMap = Abc_Clock() - clk;
//    Aig_ManScanMapping( p, 1 );

    // convert it into CNF
clk = Abc_Clock();
    Cnf_ManTransferCuts( p );
    vMapped = Cnf_ManScanMapping( p, 1, 1 );
    pCnf = Cnf_ManWriteCnfOther( p, vMapped );
    pCnf->vMapping = Cnf_ManWriteCnfMapping( p, vMapped );
    Vec_PtrFree( vMapped );
    Aig_MmFixedStop( pMemCuts, 0 );
p->timeSave = Abc_Clock() - clk;

   // reset reference counters
    Aig_ManResetRefs( pAig );
//ABC_PRT( "Cuts   ", p->timeCuts );
//ABC_PRT( "Map    ", p->timeMap  );
//ABC_PRT( "Saving ", p->timeSave );
    return pCnf;
}